

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<QGraphicsItemAnimationPrivate::Pair>::insert
          (QPodArrayOps<QGraphicsItemAnimationPrivate::Pair> *this,qsizetype i,qsizetype n,
          parameter_type t)

{
  long lVar1;
  qreal qVar2;
  qreal qVar3;
  Pair *pPVar4;
  qreal *in_RCX;
  QArrayDataPointer<QGraphicsItemAnimationPrivate::Pair> *in_RDX;
  long in_RSI;
  QArrayDataPointer<QGraphicsItemAnimationPrivate::Pair> *in_RDI;
  long in_FS_OFFSET;
  Pair *where;
  GrowthPosition pos;
  Pair copy;
  Pair **in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar5;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  qVar2 = *in_RCX;
  qVar3 = in_RCX[1];
  uVar5 = 0;
  if ((in_RDI->size != 0) && (in_RSI == 0)) {
    uVar5 = 1;
  }
  QArrayDataPointer<QGraphicsItemAnimationPrivate::Pair>::detachAndGrow
            (in_RDX,(GrowthPosition)((ulong)in_RCX >> 0x20),
             CONCAT44(uVar5,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8,in_RDI);
  pPVar4 = createHole((QPodArrayOps<QGraphicsItemAnimationPrivate::Pair> *)in_RDX,
                      (GrowthPosition)((ulong)in_RCX >> 0x20),
                      CONCAT44(uVar5,in_stack_ffffffffffffffc0),(qsizetype)in_stack_ffffffffffffffb8
                     );
  while (in_RDX != (QArrayDataPointer<QGraphicsItemAnimationPrivate::Pair> *)0x0) {
    pPVar4->step = qVar2;
    pPVar4->value = qVar3;
    pPVar4 = pPVar4 + 1;
    in_RDX = (QArrayDataPointer<QGraphicsItemAnimationPrivate::Pair> *)((long)&in_RDX[-1].size + 7);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        typename Data::GrowthPosition pos = Data::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = Data::GrowsAtBeginning;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        T *where = createHole(pos, i, n);
        while (n--)
            *where++ = copy;
    }